

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseConnection(StructuralParser *this,Graph *graph)

{
  Allocator *pAVar1;
  UnqualifiedName *pUVar2;
  bool bVar3;
  Expression *pEVar4;
  SharedEndpoint *pSVar5;
  size_t sVar6;
  Connection *o;
  pool_ref<soul::AST::Connection::SharedEndpoint> *ppVar7;
  DotOperator *pDVar8;
  char (*args) [53];
  CompileMessage local_250;
  pool_ref<soul::AST::Expression> local_218;
  pool_ptr<soul::AST::DotOperator> local_210;
  pool_ptr<soul::AST::DotOperator> dot;
  pool_ref<soul::AST::Connection> local_1c8;
  pool_ref<soul::AST::Connection::SharedEndpoint> *local_1c0;
  pool_ref<soul::AST::Connection::SharedEndpoint> *dest;
  pool_ref<soul::AST::Connection::SharedEndpoint> *__end4;
  pool_ref<soul::AST::Connection::SharedEndpoint> *__begin4;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *__range4;
  pool_ref<soul::AST::Connection::SharedEndpoint> *source;
  pool_ref<soul::AST::Connection::SharedEndpoint> *__end3;
  pool_ref<soul::AST::Connection::SharedEndpoint> *__begin3;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *__range3;
  char *local_148;
  pool_ref<soul::AST::Connection::SharedEndpoint> local_140;
  undefined1 local_138 [40];
  char *local_110;
  pool_ref<soul::AST::Connection::SharedEndpoint> local_f8;
  pool_ptr<soul::AST::Expression> local_f0;
  pool_ptr<soul::AST::Expression> delayLength;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> dests;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> sources;
  Context context;
  InterpolationType interpolationType;
  Graph *graph_local;
  StructuralParser *this_local;
  
  context.parentScope._4_4_ = parseOptionalInterpolationType(this);
  getContext((Context *)(sources.space + 7),this);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
  ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *)
             (dests.space + 7));
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
  ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *)
             &delayLength);
  pool_ptr<soul::AST::Expression>::pool_ptr(&local_f0);
  do {
    pAVar1 = this->allocator;
    pEVar4 = parseExpression(this,false);
    pSVar5 = AST::Allocator::allocate<soul::AST::Connection::SharedEndpoint,soul::AST::Expression&>
                       (pAVar1,pEVar4);
    pool_ref<soul::AST::Connection::SharedEndpoint>::
    pool_ref<soul::AST::Connection::SharedEndpoint,void>(&local_f8,pSVar5);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::push_back
              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *
               )(dests.space + 7),&local_f8);
    pool_ref<soul::AST::Connection::SharedEndpoint>::~pool_ref(&local_f8);
    local_110 = ",";
    bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
  } while (bVar3);
  while( true ) {
    getContext((Context *)(local_138 + 0x10),this);
    AST::Context::operator=((Context *)(sources.space + 7),(Context *)(local_138 + 0x10));
    AST::Context::~Context((Context *)(local_138 + 0x10));
    local_138._8_8_ = "->";
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e748);
    parseDelayLength((StructuralParser *)local_138);
    local_f0.object = (Expression *)local_138._0_8_;
    pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)local_138);
    do {
      pAVar1 = this->allocator;
      pEVar4 = parseConnectionPoint(this);
      pSVar5 = AST::Allocator::
               allocate<soul::AST::Connection::SharedEndpoint,soul::AST::Expression&>(pAVar1,pEVar4)
      ;
      pool_ref<soul::AST::Connection::SharedEndpoint>::
      pool_ref<soul::AST::Connection::SharedEndpoint,void>(&local_140,pSVar5);
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::push_back
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                  *)&delayLength,&local_140);
      pool_ref<soul::AST::Connection::SharedEndpoint>::~pool_ref(&local_140);
      local_148 = ",";
      bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
    } while (bVar3);
    sVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::size
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                        *)(dests.space + 7));
    if ((1 < sVar6) &&
       (sVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
                size((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                      *)&delayLength), 1 < sVar6)) {
      Errors::notYetImplemented<char_const(&)[53]>
                ((CompileMessage *)&__range3,
                 (Errors *)"Many-to-many connections are not currently supported",args);
      AST::Context::throwError((Context *)(sources.space + 7),(CompileMessage *)&__range3,false);
    }
    __begin3 = (pool_ref<soul::AST::Connection::SharedEndpoint> *)(dests.space + 7);
    __end3 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
             begin((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                    *)__begin3);
    source = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::end
                       ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                         *)__begin3);
    for (; __end3 != source; __end3 = __end3 + 1) {
      __range4 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                  *)__end3;
      __begin4 = (pool_ref<soul::AST::Connection::SharedEndpoint> *)&delayLength;
      __end4 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
               begin((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                      *)__begin4);
      dest = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::end
                       ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                         *)__begin4);
      for (; __end4 != dest; __end4 = __end4 + 1) {
        local_1c0 = __end4;
        o = allocate<soul::AST::Connection,soul::AST::Context&,soul::InterpolationType&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ptr<soul::AST::Expression>&>
                      (this,(Context *)(sources.space + 7),
                       (InterpolationType *)((long)&context.parentScope + 4),
                       (pool_ref<soul::AST::Connection::SharedEndpoint> *)__range4,__end4,&local_f0)
        ;
        pool_ref<soul::AST::Connection>::pool_ref<soul::AST::Connection,void>(&local_1c8,o);
        std::
        vector<soul::pool_ref<soul::AST::Connection>,_std::allocator<soul::pool_ref<soul::AST::Connection>_>_>
        ::push_back(&graph->connections,&local_1c8);
        pool_ref<soul::AST::Connection>::~pool_ref(&local_1c8);
      }
    }
    bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)0x54e748);
    if (!bVar3) break;
    sVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::size
                      ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                        *)&delayLength);
    if (sVar6 != 1) {
      ppVar7 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
               back((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                     *)&delayLength);
      pSVar5 = pool_ref<soul::AST::Connection::SharedEndpoint>::operator->(ppVar7);
      pEVar4 = pool_ref<soul::AST::Expression>::operator->(&pSVar5->endpoint);
      Errors::cannotChainConnectionWithMultiple<>();
      AST::Context::throwError
                (&(pEVar4->super_Statement).super_ASTObject.context,(CompileMessage *)&dot,false);
    }
    ppVar7 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
             back((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>
                   *)&delayLength);
    pSVar5 = pool_ref<soul::AST::Connection::SharedEndpoint>::operator->(ppVar7);
    local_218.object = (pSVar5->endpoint).object;
    cast<soul::AST::DotOperator,soul::AST::Expression>((soul *)&local_210,&local_218);
    pool_ref<soul::AST::Expression>::~pool_ref(&local_218);
    bVar3 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_210);
    if (bVar3) {
      pDVar8 = pool_ptr<soul::AST::DotOperator>::operator->(&local_210);
      pUVar2 = pDVar8->rhs;
      Errors::cannotNameEndpointInChain<>();
      AST::Context::throwError
                (&(pUVar2->super_Expression).super_Statement.super_ASTObject.context,&local_250,
                 false);
    }
    pool_ptr<soul::AST::DotOperator>::~pool_ptr(&local_210);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::operator=
              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *
               )(dests.space + 7),
               (ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *
               )&delayLength);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::clear
              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *
               )&delayLength);
  }
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_f0);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
  ~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *)
             &delayLength);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::
  ~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *)
             (dests.space + 7));
  AST::Context::~Context((Context *)(sources.space + 7));
  return;
}

Assistant:

void parseConnection (AST::Graph& graph)
    {
        auto interpolationType = parseOptionalInterpolationType();
        auto context = getContext();
        ArrayWithPreallocation<pool_ref<AST::Connection::SharedEndpoint>, 8> sources, dests;
        pool_ptr<AST::Expression> delayLength;

        for (;;)
        {
            sources.push_back (allocator.allocate<AST::Connection::SharedEndpoint> (parseExpression()));

            if (! matchIf (Operator::comma))
                break;
        }

        for (;;)
        {
            context = getContext();
            expect (Operator::rightArrow);
            delayLength = parseDelayLength();

            for (;;)
            {
                dests.push_back (allocator.allocate<AST::Connection::SharedEndpoint> (parseConnectionPoint()));

                if (! matchIf (Operator::comma))
                    break;
            }

            if (sources.size() > 1 && dests.size() > 1)
                context.throwError (Errors::notYetImplemented ("Many-to-many connections are not currently supported"));

            for (auto& source : sources)
                for (auto& dest : dests)
                    graph.connections.push_back (allocate<AST::Connection> (context, interpolationType, source, dest, delayLength));

            if (matches (Operator::rightArrow))
            {
                if (dests.size() != 1)
                    dests.back()->endpoint->context.throwError (Errors::cannotChainConnectionWithMultiple());

                if (auto dot = cast<AST::DotOperator> (dests.back()->endpoint))
                    dot->rhs.context.throwError (Errors::cannotNameEndpointInChain());

                sources = dests;
                dests.clear();
                continue;
            }

            break;
        }
    }